

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

int RookMobility(Situation *s)

{
  byte bVar1;
  int iVar2;
  UINT8 *pUVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  int local_20 [2];
  int rook_mobility [2];
  
  local_20[0] = 0;
  local_20[1] = 0;
  pUVar3 = s->current_pieces + 0x17;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      bVar1 = pUVar3[lVar7];
      if (bVar1 != 0) {
        uVar10 = (ulong)((bVar1 & 0xf) << 0xc);
        uVar5 = (uint)*(byte *)(uVar10 + 0x304d40 + (ulong)s->bit_row[bVar1 >> 4] * 8) -
                (uint)*(byte *)(uVar10 + 0x304d41 + (ulong)s->bit_row[bVar1 >> 4] * 8);
        uVar9 = -uVar5;
        if (0 < (int)uVar5) {
          uVar9 = uVar5;
        }
        lVar8 = (ulong)(bVar1 >> 4) * 0x2000;
        uVar6 = (uint)*(byte *)(lVar8 + 0x30ad40 + (ulong)s->bit_col[bVar1 & 0xf] * 8) -
                (uint)*(byte *)(lVar8 + 0x30ad41 + (ulong)s->bit_col[bVar1 & 0xf] * 8);
        uVar5 = -uVar6;
        if (0 < (int)uVar6) {
          uVar5 = uVar6;
        }
        local_20[lVar4] = (uVar5 & 0xff) + (uVar9 & 0xff) + local_20[lVar4];
      }
    }
    pUVar3 = pUVar3 + 0x10;
  }
  iVar2 = -(local_20[0] - local_20[1]);
  if (s->current_player == 0) {
    iVar2 = local_20[0] - local_20[1];
  }
  return iVar2;
}

Assistant:

int RookMobility(Situation &s)
{
    int SideTag;
    int rook_mobility[2] = {0};
    for (int r = 0; r < 2; r++)
    {
        SideTag = 16 + (r << 4);
        for (int i = 7; i <= 8; i++)
        {
            if (s.current_pieces[SideTag + i] != 0)
            {
                int piece_from = s.current_pieces[SideTag + i];
                int col = GetCol(piece_from), row = GetRow(piece_from);

                int get_col_1 = ROOK_CANNON_CAN_GET_ROW[col - 3][s.bit_row[row]].no_capture[0]; //右方向
                int get_col_2 = ROOK_CANNON_CAN_GET_ROW[col - 3][s.bit_row[row]].no_capture[1]; //左方向
                rook_mobility[r] += abs(get_col_1 - get_col_2);

                int get_row_1 = ROOK_CANNON_CAN_GET_COL[row - 3][s.bit_col[col]].no_capture[0]; //下方向
                int get_row_2 = ROOK_CANNON_CAN_GET_COL[row - 3][s.bit_col[col]].no_capture[1]; //上方向
                rook_mobility[r] += abs(get_row_1 - get_row_2);
            }
        }
    }

    return SideValue(s.current_player, rook_mobility[RED] - rook_mobility[BLACK]);
}